

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_token.cpp
# Opt level: O1

TOKEN CNetTokenManager::GenerateToken(NETADDR *pAddr,int64 Seed)

{
  uint uVar1;
  TOKEN TVar2;
  long lVar3;
  long in_FS_OFFSET;
  char aBuf [32];
  NETADDR Addr;
  uint aDigest [4];
  int64 local_90;
  undefined1 local_88 [24];
  undefined1 local_70 [16];
  uint local_60;
  undefined1 local_5c [20];
  uchar local_48 [16];
  uint local_38 [6];
  long local_20;
  
  while( true ) {
    local_20 = *(long *)(in_FS_OFFSET + 0x28);
    local_90 = Seed;
    if ((pAddr->type & 4) == 0) break;
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) goto LAB_0013d79e;
    pAddr = &GenerateToken::NullAddr;
  }
  mem_zero(&local_60,0x18);
  mem_copy(local_5c,pAddr->ip,0x10);
  local_60 = pAddr->type;
  mem_copy(local_88,&local_60,0x18);
  mem_copy(local_70,&local_90,8);
  local_48 = (uchar  [16])md5(local_88,0x20);
  lVar3 = 0;
  do {
    uVar1 = bytes_be_to_uint(local_48 + lVar3);
    *(uint *)((long)local_38 + lVar3) = uVar1;
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x10);
  uVar1 = local_38[3] ^ local_38[1] ^ local_38[2] ^ local_38[0];
  TVar2 = 0xfffffffe;
  if (uVar1 < 0xfffffffe) {
    TVar2 = uVar1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return TVar2;
  }
LAB_0013d79e:
  __stack_chk_fail();
}

Assistant:

TOKEN CNetTokenManager::GenerateToken(const NETADDR *pAddr, int64 Seed)
{
	static const NETADDR NullAddr = { 0 };
	NETADDR Addr;
	char aBuf[sizeof(NETADDR) + sizeof(int64)];
	unsigned int Result;

	if(pAddr->type & NETTYPE_LINK_BROADCAST)
		return GenerateToken(&NullAddr, Seed);

	mem_zero(&Addr, sizeof(NETADDR));
	mem_copy(Addr.ip, pAddr->ip, sizeof(Addr.ip));
	Addr.type = pAddr->type;

	mem_copy(aBuf, &Addr, sizeof(NETADDR));
	mem_copy(aBuf + sizeof(NETADDR), &Seed, sizeof(int64));

	Result = Hash(aBuf, sizeof(aBuf)) & NET_TOKEN_MASK;
	if(Result == NET_TOKEN_NONE)
		Result--;

	return Result;
}